

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_>
chaiscript::dispatch::detail::
call_func<chaiscript::dispatch::detail::Constructor<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&>,std::shared_ptr<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&,0ul,1ul>
          (element_type *param_1,undefined8 param_2,
          Constructor<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_const_chaiscript::Boxed_Value_&,_const_chaiscript::Boxed_Value_&>
          *param_3,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                   *param_4)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_> sVar1;
  Type_Conversions_State *in_stack_00000090;
  Boxed_Value *in_stack_00000098;
  element_type *inner;
  
  inner = param_1;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (param_4,0);
  boxed_cast<chaiscript::Boxed_Value_const&>(in_stack_00000098,in_stack_00000090);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::operator[]
            (param_4,1);
  boxed_cast<chaiscript::Boxed_Value_const&>(in_stack_00000098,in_stack_00000090);
  Constructor<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&>
  ::operator()(param_3,&inner->first,&param_1->first);
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x42dc4a);
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x42dc54);
  sVar1.
  super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.
  super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = inner;
  return (shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_>)
         sVar1.
         super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Ret call_func(const chaiscript::dispatch::detail::Function_Signature<Ret (Params...)> &, Indexes<I...>, const Callable &f,
            const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          (void)params; (void)t_conversions;
          return f(boxed_cast<Params>(params[I], &t_conversions)...);
        }